

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

bool __thiscall chatter::Protocol::disconnect(Protocol *this,Peer *peer)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __n;
  int in_R8D;
  bool bVar2;
  shared_ptr<chatter::Packet> local_50 [2];
  undefined1 local_30 [8];
  ptr p;
  Peer *peer_local;
  Protocol *this_local;
  
  bVar2 = peer->m_state == CONNECTED;
  if (bVar2) {
    p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peer;
    Packet::create((int)(__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30,'\0');
    __n._M_pi = p.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    peVar1 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    peVar1->m_peer = (Peer *)__n._M_pi;
    peVar1 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    Packet::set_type(peVar1,DISCONNECT_NOTIFY);
    peVar1 = std::__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatter::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    Packet::set_flag(peVar1,RELIABLE);
    std::shared_ptr<chatter::Packet>::shared_ptr(local_50,(shared_ptr<chatter::Packet> *)local_30);
    send(this,(int)local_50,(void *)0x1,(size_t)__n._M_pi,in_R8D);
    std::shared_ptr<chatter::Packet>::~shared_ptr(local_50);
    std::shared_ptr<chatter::Packet>::~shared_ptr((shared_ptr<chatter::Packet> *)local_30);
  }
  return bVar2;
}

Assistant:

bool Protocol::disconnect(Peer* peer)
{
    if (peer->m_state != PeerState::CONNECTED)
        return false;

    auto p = Packet::create();
    p->m_peer = peer;
    p->set_type(PacketType::DISCONNECT_NOTIFY);
    p->set_flag(PacketFlag::RELIABLE);

    send(p, true);

    return true;
}